

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

void __thiscall cmPolicies::PolicyMap::Set(PolicyMap *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  PolicyStatus status_local;
  PolicyID id_local;
  PolicyMap *this_local;
  
  local_28._16_4_ = status;
  local_28._20_4_ = id;
  _status_local = this;
  std::bitset<429UL>::operator[]((bitset<429UL> *)local_28,(size_t)this);
  std::bitset<429UL>::reference::operator=((reference *)local_28,status == OLD);
  std::bitset<429UL>::reference::~reference((reference *)local_28);
  bVar1 = local_28._16_4_ == WARN;
  std::bitset<429UL>::operator[]((bitset<429UL> *)local_38,(size_t)this);
  std::bitset<429UL>::reference::operator=((reference *)local_38,bVar1);
  std::bitset<429UL>::reference::~reference((reference *)local_38);
  bVar1 = local_28._16_4_ == NEW;
  std::bitset<429UL>::operator[]((bitset<429UL> *)local_48,(size_t)this);
  std::bitset<429UL>::reference::operator=((reference *)local_48,bVar1);
  std::bitset<429UL>::reference::~reference((reference *)local_48);
  return;
}

Assistant:

void cmPolicies::PolicyMap::Set(cmPolicies::PolicyID id,
                                cmPolicies::PolicyStatus status)
{
  this->Status[(POLICY_STATUS_COUNT * id) + OLD] = (status == OLD);
  this->Status[(POLICY_STATUS_COUNT * id) + WARN] = (status == WARN);
  this->Status[(POLICY_STATUS_COUNT * id) + NEW] = (status == NEW);
}